

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileSet.cxx
# Opt level: O2

void __thiscall
cmFileSet::EvaluateFileEntry
          (cmFileSet *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *dirs,map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                *filesPerDir,
          unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
          *cge,cmLocalGenerator *lg,string *config,cmGeneratorTarget *target,
          cmGeneratorExpressionDAGChecker *dagChecker)

{
  string *psVar1;
  pointer pbVar2;
  bool bVar3;
  bool bVar4;
  string *psVar5;
  mapped_type *this_00;
  ostream *poVar6;
  cmake *this_01;
  pointer pbVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *dir;
  pointer pbVar8;
  string_view arg;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  string relDir;
  string collapsedFile;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_240;
  string local_228;
  string files;
  string file;
  string local_1c8;
  string collapsedDir;
  
  collapsedDir._M_dataplus._M_p = (pointer)&collapsedDir.field_2;
  collapsedDir._M_string_length = 0;
  collapsedDir.field_2._M_local_buf[0] = '\0';
  psVar5 = cmCompiledGeneratorExpression::Evaluate
                     ((cge->_M_t).
                      super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
                      .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl,lg
                      ,config,target,dagChecker,(cmGeneratorTarget *)0x0,&collapsedDir);
  std::__cxx11::string::string((string *)&files,(string *)psVar5);
  std::__cxx11::string::~string((string *)&collapsedDir);
  arg._M_str = files._M_dataplus._M_p;
  arg._M_len = files._M_string_length;
  cmExpandedList_abi_cxx11_(&local_240,arg,false);
  pbVar7 = local_240.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (pbVar7 == local_240.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) break;
    std::__cxx11::string::string((string *)&file,(string *)pbVar7);
    bVar3 = cmsys::SystemTools::FileIsFullPath(&file);
    if (!bVar3) {
      psVar5 = cmLocalGenerator::GetCurrentSourceDirectory_abi_cxx11_(lg);
      collapsedDir._M_string_length = (size_type)(psVar5->_M_dataplus)._M_p;
      collapsedDir._M_dataplus._M_p = (pointer)psVar5->_M_string_length;
      collapsedFile._M_dataplus._M_p = (pointer)0x1;
      collapsedFile._M_string_length = (size_type)&collapsedFile.field_2;
      collapsedFile.field_2._M_local_buf[0] = '/';
      cmStrCat<std::__cxx11::string>
                (&relDir,(cmAlphaNum *)&collapsedDir,(cmAlphaNum *)&collapsedFile,&file);
      std::__cxx11::string::operator=((string *)&file,(string *)&relDir);
      std::__cxx11::string::~string((string *)&relDir);
    }
    cmsys::SystemTools::CollapseFullPath(&collapsedFile,&file);
    relDir._M_dataplus._M_p = (pointer)&relDir.field_2;
    relDir._M_string_length = 0;
    relDir.field_2._M_local_buf[0] = '\0';
    psVar5 = (dirs->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    psVar1 = (dirs->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    bVar3 = false;
    do {
      if (psVar5 == psVar1) break;
      cmsys::SystemTools::CollapseFullPath(&collapsedDir,psVar5);
      bVar4 = cmsys::SystemTools::IsSubDirectory(&collapsedFile,&collapsedDir);
      if (bVar4) {
        cmSystemTools::RelativePath(&local_228,&collapsedDir,&collapsedFile);
        cmsys::SystemTools::GetParentDirectory(&local_1c8,&local_228);
        std::__cxx11::string::operator=((string *)&relDir,(string *)&local_1c8);
        std::__cxx11::string::~string((string *)&local_1c8);
        std::__cxx11::string::~string((string *)&local_228);
        bVar3 = true;
      }
      std::__cxx11::string::~string((string *)&collapsedDir);
      psVar5 = psVar5 + 1;
    } while (!bVar4);
    if (bVar3) {
      this_00 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                ::operator[](filesPerDir,&relDir);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(this_00,&file);
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&collapsedDir);
      poVar6 = std::operator<<((ostream *)&collapsedDir,"File:\n  ");
      poVar6 = std::operator<<(poVar6,(string *)&file);
      std::operator<<(poVar6,"\nmust be in one of the file set\'s base directories:");
      pbVar2 = (dirs->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar8 = (dirs->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start; pbVar8 != pbVar2;
          pbVar8 = pbVar8 + 1) {
        poVar6 = std::operator<<((ostream *)&collapsedDir,"\n  ");
        std::operator<<(poVar6,(string *)pbVar8);
      }
      this_01 = cmLocalGenerator::GetCMakeInstance(lg);
      std::__cxx11::stringbuf::str();
      std::
      __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ::__shared_ptr((__shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                      *)&local_228,
                     (__shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                      *)(cge->_M_t).
                        super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
                        .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl)
      ;
      cmake::IssueMessage(this_01,FATAL_ERROR,&local_1c8,(cmListFileBacktrace *)&local_228);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_228._M_string_length);
      std::__cxx11::string::~string((string *)&local_1c8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&collapsedDir);
    }
    std::__cxx11::string::~string((string *)&relDir);
    std::__cxx11::string::~string((string *)&collapsedFile);
    std::__cxx11::string::~string((string *)&file);
    pbVar7 = pbVar7 + 1;
  } while (bVar3);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_240);
  std::__cxx11::string::~string((string *)&files);
  return;
}

Assistant:

void cmFileSet::EvaluateFileEntry(
  const std::vector<std::string>& dirs,
  std::map<std::string, std::vector<std::string>>& filesPerDir,
  const std::unique_ptr<cmCompiledGeneratorExpression>& cge,
  cmLocalGenerator* lg, const std::string& config,
  const cmGeneratorTarget* target,
  cmGeneratorExpressionDAGChecker* dagChecker) const
{
  auto files = cge->Evaluate(lg, config, target, dagChecker);
  for (std::string file : cmExpandedList(files)) {
    if (!cmSystemTools::FileIsFullPath(file)) {
      file = cmStrCat(lg->GetCurrentSourceDirectory(), '/', file);
    }
    auto collapsedFile = cmSystemTools::CollapseFullPath(file);
    bool found = false;
    std::string relDir;
    for (auto const& dir : dirs) {
      auto collapsedDir = cmSystemTools::CollapseFullPath(dir);
      if (cmSystemTools::IsSubDirectory(collapsedFile, collapsedDir)) {
        found = true;
        relDir = cmSystemTools::GetParentDirectory(
          cmSystemTools::RelativePath(collapsedDir, collapsedFile));
        break;
      }
    }
    if (!found) {
      std::ostringstream e;
      e << "File:\n  " << file
        << "\nmust be in one of the file set's base directories:";
      for (auto const& dir : dirs) {
        e << "\n  " << dir;
      }
      lg->GetCMakeInstance()->IssueMessage(MessageType::FATAL_ERROR, e.str(),
                                           cge->GetBacktrace());
      return;
    }

    filesPerDir[relDir].push_back(file);
  }
}